

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.c
# Opt level: O2

void nni_sock_remove_listener(nni_listener *l)

{
  int iVar1;
  nni_mtx *mtx;
  
  mtx = &l->l_sock->s_mx;
  nni_mtx_lock(mtx);
  iVar1 = nni_list_node_active(&l->l_node);
  if (iVar1 == 0) {
    nni_panic("%s: %d: assert err: %s",
              "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/socket.c",
              0x376,"nni_list_node_active(&l->l_node)");
  }
  nni_list_node_remove(&l->l_node);
  nni_mtx_unlock(mtx);
  nni_listener_rele(l);
  return;
}

Assistant:

void
nni_sock_remove_listener(nni_listener *l)
{
	nni_sock *s = l->l_sock;
	nni_mtx_lock(&s->s_mx);
	NNI_ASSERT(nni_list_node_active(&l->l_node));
	nni_list_node_remove(&l->l_node);
	nni_mtx_unlock(&s->s_mx);

	// also drop the hold from the socket
	nni_listener_rele(l);
}